

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3DbRealloc(sqlite3 *db,void *p,int n)

{
  int iVar1;
  void *pvVar2;
  void *local_30;
  void *pNew;
  int n_local;
  void *p_local;
  sqlite3 *db_local;
  
  local_30 = (void *)0x0;
  if (db->mallocFailed == '\0') {
    if (p == (void *)0x0) {
      pvVar2 = sqlite3DbMallocRaw(db,n);
      return pvVar2;
    }
    iVar1 = isLookaside(db,p);
    if (iVar1 == 0) {
      local_30 = sqlite3_realloc(p,n);
      if (local_30 == (void *)0x0) {
        db->mallocFailed = '\x01';
      }
    }
    else {
      if (n <= (int)(uint)(db->lookaside).sz) {
        return p;
      }
      local_30 = sqlite3DbMallocRaw(db,n);
      if (local_30 != (void *)0x0) {
        memcpy(local_30,p,(ulong)(db->lookaside).sz);
        sqlite3DbFree(db,p);
      }
    }
  }
  return local_30;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbRealloc(sqlite3 *db, void *p, int n){
  void *pNew = 0;
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  if( db->mallocFailed==0 ){
    if( p==0 ){
      return sqlite3DbMallocRaw(db, n);
    }
    if( isLookaside(db, p) ){
      if( n<=db->lookaside.sz ){
        return p;
      }
      pNew = sqlite3DbMallocRaw(db, n);
      if( pNew ){
        memcpy(pNew, p, db->lookaside.sz);
        sqlite3DbFree(db, p);
      }
    }else{
      assert( sqlite3MemdebugHasType(p, MEMTYPE_DB) );
      assert( sqlite3MemdebugHasType(p, MEMTYPE_LOOKASIDE|MEMTYPE_HEAP) );
      sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
      pNew = sqlite3_realloc(p, n);
      if( !pNew ){
        sqlite3MemdebugSetType(p, MEMTYPE_DB|MEMTYPE_HEAP);
        db->mallocFailed = 1;
      }
      sqlite3MemdebugSetType(pNew, MEMTYPE_DB | 
            (db->lookaside.bEnabled ? MEMTYPE_LOOKASIDE : MEMTYPE_HEAP));
    }
  }
  return pNew;
}